

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr162.cpp
# Opt level: O3

void ComputeFk(IkReal *j,IkReal *eetrans,IkReal *eerot)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  dVar1 = cos(*j);
  dVar2 = cos(j[1]);
  dVar3 = sin(j[2]);
  dVar4 = cos(j[2]);
  dVar5 = sin(j[1]);
  dVar6 = sin(j[3]);
  dVar7 = cos(j[3]);
  dVar8 = sin(*j);
  dVar9 = sin(j[4]);
  dVar10 = cos(j[4]);
  dVar11 = sin(j[5]);
  dVar12 = cos(j[5]);
  dVar13 = dVar4 * dVar5;
  dVar20 = dVar1 * dVar2;
  dVar23 = -dVar1 * dVar13 - dVar20 * dVar3;
  dVar17 = dVar23 * dVar6 + dVar7 * dVar8;
  dVar14 = dVar8 * 0.158;
  dVar15 = dVar3 * dVar5;
  dVar21 = dVar2 * dVar3;
  dVar22 = (-dVar21 - dVar13) * dVar8;
  dVar4 = dVar4 * dVar2;
  dVar19 = -dVar1 * dVar6 - dVar22 * dVar7;
  dVar24 = (dVar4 - dVar15) * dVar1;
  dVar18 = dVar24 * dVar9;
  dVar16 = (dVar6 * dVar8 - dVar23 * dVar7) * dVar10;
  *eerot = dVar24 * dVar10 + (dVar23 * dVar7 - dVar6 * dVar8) * dVar9;
  eerot[1] = dVar12 * dVar17 + (-dVar16 - dVar18) * dVar11;
  eerot[2] = dVar17 * dVar11 + (dVar18 + dVar16) * dVar12;
  dVar16 = dVar1 * 0.158;
  dVar17 = dVar3 * 0.035;
  *eetrans = dVar1 * 0.26 +
             dVar20 * 0.68 +
             dVar1 * 0.67 * dVar4 +
             ((((dVar23 * dVar7 * 0.158 - dVar14 * dVar6) * dVar9 +
               dVar1 * -0.035 * dVar13 + (dVar16 * dVar4 - dVar16 * dVar15) * dVar10) -
              dVar1 * 0.67 * dVar15) - dVar17 * dVar20);
  dVar20 = dVar4 * dVar8 - dVar8 * dVar15;
  dVar18 = dVar22 * dVar6 * -1.0 + dVar7 * dVar1;
  eerot[3] = dVar19 * dVar9 + dVar10 * (-dVar8 * dVar4 + dVar8 * dVar15);
  eerot[4] = (dVar19 * dVar10 + dVar20 * dVar9) * dVar11 + dVar12 * dVar18;
  eerot[5] = dVar18 * dVar11 +
             (dVar20 * -dVar9 - (-dVar22 * dVar7 - dVar1 * dVar6) * dVar10) * dVar12;
  eetrans[1] = dVar8 * 0.67 * dVar15 +
               dVar13 * 0.035 * dVar8 +
               (dVar14 * dVar15 - dVar4 * dVar14) * dVar10 +
               dVar2 * dVar8 * -0.68 +
               ((dVar17 * dVar2 * dVar8 +
                (-(dVar7 * 0.158) * dVar22 - dVar16 * dVar6) * dVar9 + dVar8 * -0.26) -
               dVar8 * 0.67 * dVar4);
  dVar1 = dVar15 - dVar4;
  eerot[6] = dVar1 * dVar9 * dVar7 + dVar10 * (dVar13 * -1.0 + -dVar2 * dVar3);
  eerot[7] = dVar12 * dVar6 * dVar1 + dVar11 * (dVar9 * (dVar21 + dVar13) + dVar10 * dVar1 * dVar7);
  eerot[8] = dVar6 * dVar1 * dVar11 + ((dVar21 + dVar13) * -dVar9 - dVar1 * dVar7 * dVar10) * dVar12
  ;
  eetrans[2] = dVar13 * -0.67 +
               dVar5 * -0.68 +
               (dVar21 * -0.158 + dVar13 * -0.158) * dVar10 +
               dVar17 * dVar5 +
               dVar21 * -0.67 +
               dVar4 * -0.035 + (dVar15 * 0.158 + dVar4 * -0.158) * dVar9 * dVar7 + 0.675;
  return;
}

Assistant:

IKFAST_API void ComputeFk(const IkReal* j, IkReal* eetrans, IkReal* eerot) {
IkReal x0,x1,x2,x3,x4,x5,x6,x7,x8,x9,x10,x11,x12,x13,x14,x15,x16,x17,x18,x19,x20,x21,x22,x23,x24,x25,x26,x27,x28,x29,x30,x31,x32,x33,x34,x35,x36,x37,x38,x39,x40,x41,x42,x43,x44,x45,x46,x47,x48,x49,x50,x51;
x0=IKcos(j[0]);
x1=IKcos(j[1]);
x2=IKsin(j[2]);
x3=IKcos(j[2]);
x4=IKsin(j[1]);
x5=IKsin(j[3]);
x6=IKcos(j[3]);
x7=IKsin(j[0]);
x8=IKsin(j[4]);
x9=IKcos(j[4]);
x10=IKsin(j[5]);
x11=IKcos(j[5]);
x12=((0.67)*x0);
x13=((1.0)*x6);
x14=((0.158)*x6);
x15=((0.158)*x0);
x16=((0.035)*x2);
x17=((1.0)*x7);
x18=((0.158)*x7);
x19=((1.0)*x2);
x20=((0.67)*x7);
x21=((1.0)*x0);
x22=(x0*x5);
x23=(x1*x3);
x24=(x3*x4);
x25=((-1.0)*x9);
x26=((-1.0)*x8);
x27=(x6*x8);
x28=(x2*x4);
x29=(x1*x7);
x30=(x0*x1);
x31=(x1*x2);
x32=(x17*x5);
x33=(x0*x13);
x34=(x17*x28);
x35=((((-1.0)*x23))+x28);
x36=(x31+x24);
x37=(x35*x5);
x38=(x35*x6);
x39=(x0*(((((-1.0)*x19*x4))+x23)));
x40=((((-1.0)*x34))+((x23*x7)));
x41=(x38*x9);
x42=((((-1.0)*x21*x24))+(((-1.0)*x19*x30)));
x43=(x17*(((((-1.0)*x31))+(((-1.0)*x24)))));
x44=(x39*x8);
x45=(x42*x6);
x46=(x43*x5);
x47=((-1.0)*x43);
x48=(((x42*x5))+((x6*x7)));
x49=(x32+(((-1.0)*x13*x42)));
x50=((((-1.0)*x21*x5))+(((-1.0)*x13*x43)));
x51=(x49*x9);
eerot[0]=(((x39*x9))+((x8*(((((-1.0)*x32))+x45)))));
eerot[1]=(((x11*x48))+((x10*(((((-1.0)*x44))+(((-1.0)*x51)))))));
eerot[2]=(((x10*x48))+((x11*((x44+x51)))));
IkReal x52=((1.0)*x28);
eetrans[0]=((((-0.035)*x0*x24))+((x9*(((((-1.0)*x15*x52))+((x15*x23))))))+((x8*(((((-1.0)*x18*x5))+((x14*x42))))))+(((-1.0)*x12*x52))+(((-1.0)*x16*x30))+((x12*x23))+(((0.68)*x30))+(((0.26)*x0)));
eerot[3]=(((x50*x8))+((x9*(((((-1.0)*x17*x23))+x34)))));
eerot[4]=(((x10*((((x50*x9))+((x40*x8))))))+((x11*(((((-1.0)*x46))+x33)))));
eerot[5]=(((x10*(((((-1.0)*x46))+x33))))+((x11*((((x26*x40))+((x25*((((x47*x6))+(((-1.0)*x22)))))))))));
IkReal x53=((1.0)*x23);
eetrans[1]=(((x8*(((((-1.0)*x14*x43))+(((-1.0)*x15*x5))))))+(((-0.26)*x7))+((x16*x29))+(((-1.0)*x20*x53))+(((-0.68)*x29))+((x9*((((x18*x28))+(((-1.0)*x18*x53))))))+(((0.035)*x24*x7))+((x20*x28)));
eerot[6]=(((x27*x35))+((x9*(((((-1.0)*x24))+(((-1.0)*x1*x19)))))));
eerot[7]=(((x11*x37))+((x10*((x41+((x36*x8)))))));
eerot[8]=(((x10*x37))+((x11*((((x26*x36))+((x25*x38)))))));
eetrans[2]=((0.675)+((x27*(((((0.158)*x28))+(((-0.158)*x23))))))+(((-0.035)*x23))+(((-0.67)*x31))+((x16*x4))+((x9*(((((-0.158)*x31))+(((-0.158)*x24))))))+(((-0.68)*x4))+(((-0.67)*x24)));
}